

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::Matches
          (OnCallSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<int>>,std::tuple<mp::expr::Kind,int>>
                    ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_> *)
                     (this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<mp::expr::Kind,_int>_&>::Matches
                      ((MatcherBase<const_std::tuple<mp::expr::Kind,_int>_&> *)(this + 0x40),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }